

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_bind.h
# Opt level: O0

void pybind11::detail::
     vector_accessor<std::vector<bool,std::allocator<bool>>,pybind11::class_<std::vector<bool,std::allocator<bool>>,std::unique_ptr<std::vector<bool,std::allocator<bool>>,std::default_delete<std::vector<bool,std::allocator<bool>>>>>>
               (enable_if_t<vector_needs_copy<vector<bool>_>::value,_pybind11::class_<std::vector<bool>,_std::unique_ptr<std::vector<bool>_>_>_>
                *cl)

{
  keep_alive<0UL,_1UL> *in_stack_00000048;
  type *in_stack_00000050;
  char *in_stack_00000058;
  class_<std::vector<bool,_std::allocator<bool>_>,_std::unique_ptr<std::vector<bool,_std::allocator<bool>_>,_std::default_delete<std::vector<bool,_std::allocator<bool>_>_>_>_>
  *in_stack_00000060;
  
  class_<std::vector<bool,std::allocator<bool>>,std::unique_ptr<std::vector<bool,std::allocator<bool>>,std::default_delete<std::vector<bool,std::allocator<bool>>>>>
  ::
  def<pybind11::detail::vector_accessor<std::vector<bool,std::allocator<bool>>,pybind11::class_<std::vector<bool,std::allocator<bool>>,std::unique_ptr<std::vector<bool,std::allocator<bool>>,std::default_delete<std::vector<bool,std::allocator<bool>>>>>>(std::enable_if<vector_needs_copy<std::vector<bool,std::allocator<bool>>>::value,pybind11::class_<std::vector<bool,std::allocator<bool>>,std::unique_ptr<std::vector<bool,std::allocator<bool>>,std::default_delete<std::vector<bool,std::allocator<bool>>>>>>::type&)::_lambda(std::vector<bool,std::allocator<bool>>const&,long)_1_>
            (in_stack_00000060,in_stack_00000058,in_stack_00000050);
  class_<std::vector<bool,std::allocator<bool>>,std::unique_ptr<std::vector<bool,std::allocator<bool>>,std::default_delete<std::vector<bool,std::allocator<bool>>>>>
  ::
  def<pybind11::detail::vector_accessor<std::vector<bool,std::allocator<bool>>,pybind11::class_<std::vector<bool,std::allocator<bool>>,std::unique_ptr<std::vector<bool,std::allocator<bool>>,std::default_delete<std::vector<bool,std::allocator<bool>>>>>>(std::enable_if<vector_needs_copy<std::vector<bool,std::allocator<bool>>>::value,pybind11::class_<std::vector<bool,std::allocator<bool>>,std::unique_ptr<std::vector<bool,std::allocator<bool>>,std::default_delete<std::vector<bool,std::allocator<bool>>>>>>::type&)::_lambda(std::vector<bool,std::allocator<bool>>&)_1_,pybind11::keep_alive<0ul,1ul>>
            (in_stack_00000060,in_stack_00000058,(type *)in_stack_00000050,in_stack_00000048);
  return;
}

Assistant:

void vector_accessor(enable_if_t<vector_needs_copy<Vector>::value, Class_> &cl) {
    using T = typename Vector::value_type;
    using SizeType = typename Vector::size_type;
    using DiffType = typename Vector::difference_type;
    using ItType   = typename Vector::iterator;
    cl.def("__getitem__",
        [](const Vector &v, DiffType i) -> T {
            if (i < 0 && (i += v.size()) < 0)
                throw index_error();
            if ((SizeType)i >= v.size())
                throw index_error();
            return v[(SizeType)i];
        }
    );

    cl.def("__iter__",
           [](Vector &v) {
               return make_iterator<
                   return_value_policy::copy, ItType, ItType, T>(
                   v.begin(), v.end());
           },
           keep_alive<0, 1>() /* Essential: keep list alive while iterator exists */
    );
}